

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::add_blocked_sample
          (TypedTimeSamples<tinyusdz::value::texcoord2f> *this,double t)

{
  Sample local_28;
  
  local_28.blocked = true;
  local_28.t = t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>>
              *)this,&local_28);
  this->_dirty = true;
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }